

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantVerify(Gia_Man_t *p,int iObj)

{
  ulong uVar1;
  uint CiId;
  uint uVar2;
  word *pwVar3;
  Gia_Obj_t *pGVar4;
  uint i;
  ulong uVar5;
  
  pwVar3 = Gia_ManQuantInfoId(p,iObj);
  pGVar4 = Gia_ManObj(p,iObj);
  if ((-1 < (int)(uint)*(undefined8 *)pGVar4) &&
     (((uint)*(undefined8 *)pGVar4 & 0x1fffffff) != 0x1fffffff)) {
    uVar5 = 0;
    while (i = (uint)uVar5, (int)i < (p->vSuppVars).nSize) {
      CiId = Vec_IntEntry(&p->vSuppVars,i);
      Gia_ManIncrementTravId(p);
      uVar1 = pwVar3[uVar5 >> 6];
      uVar2 = Gia_ManQuantVerify_rec(p,iObj,CiId);
      if (((uVar1 >> (uVar5 & 0x3f) & 1) != 0) != uVar2) {
        printf("Mismatch at node %d related to CI %d (%d).\n",iObj,(ulong)CiId,
               (ulong)((pwVar3[uVar5 >> 6] >> (i & 0x3f) & 1) != 0));
      }
      uVar5 = (ulong)(i + 1);
    }
    return;
  }
  __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                ,0x59,"void Gia_ManQuantVerify(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManQuantVerify( Gia_Man_t * p, int iObj )
{
    word * pInfo = Gia_ManQuantInfoId( p, iObj );  int i, CiId;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
    {
        Gia_ManIncrementTravId( p );
        if ( Abc_TtGetBit(pInfo, i) != Gia_ManQuantVerify_rec(p, iObj, CiId) )
            printf( "Mismatch at node %d related to CI %d (%d).\n", iObj, CiId, Abc_TtGetBit(pInfo, i) );
    }
}